

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O2

SPxId __thiscall soplex::SPxSolverBase<double>::id(SPxSolverBase<double> *this,int i)

{
  DataKey DVar1;
  ulong uVar2;
  
  if (this->theRep == ROW) {
    DVar1 = (DataKey)SPxLPBase<double>::rId(&this->super_SPxLPBase<double>,i);
    uVar2 = 0xffffffff;
  }
  else {
    DVar1 = (DataKey)SPxLPBase<double>::cId(&this->super_SPxLPBase<double>,i);
    uVar2 = 1;
  }
  return (SPxId)(DataKey)((ulong)DVar1 & 0xffffffff00000000 | uVar2);
}

Assistant:

SPxId id(int i) const
   {
      if(rep() == ROW)
      {
         SPxRowId rid = SPxLPBase<R>::rId(i);
         return SPxId(rid);
      }
      else
      {
         SPxColId cid = SPxLPBase<R>::cId(i);
         return SPxId(cid);
      }
   }